

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

void guess_comptype(char *file,int32 *ispipe,int32 *isgz)

{
  int iVar1;
  size_t sVar2;
  size_t k;
  int32 *isgz_local;
  int32 *ispipe_local;
  char *file_local;
  
  sVar2 = strlen(file);
  *ispipe = 0;
  *isgz = 0;
  if ((sVar2 < 3) ||
     ((iVar1 = strcmp(file + (sVar2 - 2),".Z"), iVar1 != 0 &&
      (iVar1 = strcmp(file + (sVar2 - 2),".z"), iVar1 != 0)))) {
    if ((sVar2 < 4) ||
       ((iVar1 = strcmp(file + (sVar2 - 3),".gz"), iVar1 != 0 &&
        (iVar1 = strcmp(file + (sVar2 - 3),".GZ"), iVar1 != 0)))) {
      if ((4 < sVar2) &&
         ((iVar1 = strcmp(file + (sVar2 - 4),".bz2"), iVar1 == 0 ||
          (iVar1 = strcmp(file + (sVar2 - 4),".BZ2"), iVar1 == 0)))) {
        *ispipe = 1;
        *isgz = 3;
      }
    }
    else {
      *ispipe = 1;
      *isgz = 2;
    }
  }
  else {
    *ispipe = 1;
    *isgz = 1;
  }
  return;
}

Assistant:

static void
guess_comptype(char const *file, int32 *ispipe, int32 *isgz)
{
    size_t k;

    k = strlen(file);
    *ispipe = 0;
    *isgz = COMP_NONE;
    if ((k > 2)
        && ((strcmp(file + k - 2, ".Z") == 0)
            || (strcmp(file + k - 2, ".z") == 0))) {
        *ispipe = 1;
        *isgz = COMP_COMPRESS;
    }
    else if ((k > 3) && ((strcmp(file + k - 3, ".gz") == 0)
                        || (strcmp(file + k - 3, ".GZ") == 0))) {
        *ispipe = 1;
        *isgz = COMP_GZIP;
    }
    else if ((k > 4) && ((strcmp(file + k - 4, ".bz2") == 0)
                        || (strcmp(file + k - 4, ".BZ2") == 0))) {
        *ispipe = 1;
        *isgz = COMP_BZIP2;
    }
}